

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loader_impl.c
# Opt level: O3

value loader_impl_metadata(loader_impl impl)

{
  undefined8 uVar1;
  value pvVar2;
  loader_impl_metadata_cb_iterator_type metadata_iterator;
  undefined8 local_28;
  undefined8 local_20;
  
  uVar1 = set_size(impl->handle_impl_path_map);
  pvVar2 = (value)value_create_array(0,uVar1);
  if (pvVar2 != (value)0x0) {
    local_28 = 0;
    local_20 = value_to_array(pvVar2);
    set_iterate(impl->handle_impl_path_map,loader_impl_metadata_cb_iterate,&local_28);
  }
  return pvVar2;
}

Assistant:

value loader_impl_metadata(loader_impl impl)
{
	struct loader_impl_metadata_cb_iterator_type metadata_iterator;

	value v = value_create_array(NULL, set_size(impl->handle_impl_path_map));

	if (v == NULL)
	{
		return NULL;
	}

	metadata_iterator.iterator = 0;
	metadata_iterator.values = value_to_array(v);

	set_iterate(impl->handle_impl_path_map, &loader_impl_metadata_cb_iterate, (set_cb_iterate_args)&metadata_iterator);

	return v;
}